

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O3

void __thiscall
TEST_MockParameterTest_outputAndInputParameter_Test::testBody
          (TEST_MockParameterTest_outputAndInputParameter_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  long *plVar3;
  undefined4 extraout_var_00;
  UtestShell *pUVar4;
  TestTerminator *pTVar5;
  long lVar6;
  int returned_value;
  int return_value;
  int local_5c;
  SimpleString local_58;
  SimpleString local_48;
  SimpleString local_38;
  SimpleString local_28;
  undefined4 local_14;
  
  local_14 = 5;
  local_5c = 7;
  SimpleString::SimpleString(&local_58,"");
  pMVar2 = mock(&local_58,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_28,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_28);
  SimpleString::SimpleString(&local_38,"bar");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x58))
                             ((long *)CONCAT44(extraout_var,iVar1),&local_38,10);
  SimpleString::SimpleString(&local_48,"bar");
  (**(code **)(*plVar3 + 0x30))(plVar3,&local_48,&local_14,4);
  SimpleString::~SimpleString(&local_48);
  SimpleString::~SimpleString(&local_38);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&local_58);
  SimpleString::SimpleString(&local_58,"");
  pMVar2 = mock(&local_58,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_28,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_28);
  SimpleString::SimpleString(&local_38,"bar");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x40))
                             ((long *)CONCAT44(extraout_var_00,iVar1),&local_38,10);
  SimpleString::SimpleString(&local_48,"bar");
  (**(code **)(*plVar3 + 0x28))(plVar3,&local_48,&local_5c);
  SimpleString::~SimpleString(&local_48);
  SimpleString::~SimpleString(&local_38);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&local_58);
  pUVar4 = UtestShell::getCurrent();
  lVar6 = (long)local_5c;
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0xe])
            (pUVar4,5,lVar6,"LONGS_EQUAL(5, returned_value) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
             ,0x338,pTVar5);
  SimpleString::SimpleString(&local_58,"");
  pMVar2 = mock(&local_58,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])(pMVar2);
  SimpleString::~SimpleString(&local_58);
  return;
}

Assistant:

TEST(MockParameterTest, outputAndInputParameter)
{
    int return_value = 5;
    int returned_value = 7;

    mock().expectOneCall("foo").withParameter("bar", 10).withOutputParameterReturning("bar", &return_value, sizeof(return_value));
    mock().actualCall("foo").withParameter("bar", 10).withOutputParameter("bar", &returned_value);

    LONGS_EQUAL(5, returned_value);
    mock().checkExpectations();
}